

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall
pbrt::ParseFiles(pbrt *this,SceneRepresentation *scene,
                span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                filenames)

{
  __uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> _Var1;
  _Alloc_hider _Var2;
  bool bVar3;
  long lVar4;
  unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> t_1;
  unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> t;
  allocator<char> local_b9;
  __uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> local_b8;
  SceneRepresentation *local_b0;
  unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> local_a8;
  undefined1 local_a0 [8];
  string local_98;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  local_b0 = (SceneRepresentation *)this;
  if (filenames.ptr == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)(local_a0 + 8),"-",&local_b9);
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    local_40 = std::
               _Function_handler<void_(const_char_*,_const_pbrt::FileLoc_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:865:21)>
               ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(const_char_*,_const_pbrt::FileLoc_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:865:21)>
               ::_M_manager;
    Tokenizer::CreateFromFile
              ((Tokenizer *)&local_b8,(string *)(local_a0 + 8),
               (function<void_(const_char_*,_const_pbrt::FileLoc_*)> *)&local_58);
    std::_Function_base::~_Function_base((_Function_base *)&local_58);
    std::__cxx11::string::~string((string *)(local_a0 + 8));
    _Var1._M_t.super__Tuple_impl<0UL,_pbrt::Tokenizer_*,_std::default_delete<pbrt::Tokenizer>_>.
    super__Head_base<0UL,_pbrt::Tokenizer_*,_false>._M_head_impl =
         local_b8._M_t.
         super__Tuple_impl<0UL,_pbrt::Tokenizer_*,_std::default_delete<pbrt::Tokenizer>_>.
         super__Head_base<0UL,_pbrt::Tokenizer_*,_false>._M_head_impl;
    if ((_Tuple_impl<0UL,_pbrt::Tokenizer_*,_std::default_delete<pbrt::Tokenizer>_>)
        local_b8._M_t.
        super__Tuple_impl<0UL,_pbrt::Tokenizer_*,_std::default_delete<pbrt::Tokenizer>_>.
        super__Head_base<0UL,_pbrt::Tokenizer_*,_false>._M_head_impl != (Tokenizer *)0x0) {
      local_b8._M_t.super__Tuple_impl<0UL,_pbrt::Tokenizer_*,_std::default_delete<pbrt::Tokenizer>_>
      .super__Head_base<0UL,_pbrt::Tokenizer_*,_false>._M_head_impl =
           (tuple<pbrt::Tokenizer_*,_std::default_delete<pbrt::Tokenizer>_>)
           (_Tuple_impl<0UL,_pbrt::Tokenizer_*,_std::default_delete<pbrt::Tokenizer>_>)0x0;
      local_a0 = (undefined1  [8])
                 _Var1._M_t.
                 super__Tuple_impl<0UL,_pbrt::Tokenizer_*,_std::default_delete<pbrt::Tokenizer>_>.
                 super__Head_base<0UL,_pbrt::Tokenizer_*,_false>._M_head_impl;
      parse(local_b0,(unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)local_a0)
      ;
      std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>::~unique_ptr
                ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)local_a0);
    }
    std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>::~unique_ptr
              ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)&local_b8);
  }
  else {
    for (lVar4 = (long)filenames.ptr << 5; lVar4 != 0; lVar4 = lVar4 + -0x20) {
      bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              scene,"-");
      if (bVar3) {
        SetSearchDirectory((string *)scene);
      }
      local_78._0_8_ = 0;
      local_78._8_8_ = 0;
      local_60 = std::
                 _Function_handler<void_(const_char_*,_const_pbrt::FileLoc_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:865:21)>
                 ::_M_invoke;
      local_68 = std::
                 _Function_handler<void_(const_char_*,_const_pbrt::FileLoc_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:865:21)>
                 ::_M_manager;
      Tokenizer::CreateFromFile
                ((Tokenizer *)(local_a0 + 8),(string *)scene,
                 (function<void_(const_char_*,_const_pbrt::FileLoc_*)> *)&local_78);
      std::_Function_base::~_Function_base((_Function_base *)&local_78);
      _Var2._M_p = local_98._M_dataplus._M_p;
      if ((_Head_base<0UL,_pbrt::Tokenizer_*,_false>)local_98._M_dataplus._M_p !=
          (_Head_base<0UL,_pbrt::Tokenizer_*,_false>)0x0) {
        local_98._M_dataplus._M_p = (pointer)0x0;
        local_a8._M_t.super___uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>.
        _M_t.super__Tuple_impl<0UL,_pbrt::Tokenizer_*,_std::default_delete<pbrt::Tokenizer>_>.
        super__Head_base<0UL,_pbrt::Tokenizer_*,_false>._M_head_impl =
             (__uniq_ptr_data<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>,_true,_true>)
             (__uniq_ptr_data<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>,_true,_true>)
             _Var2._M_p;
        parse(local_b0,&local_a8);
        std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>::~unique_ptr
                  (&local_a8);
      }
      std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>::~unique_ptr
                ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)
                 (local_a0 + 8));
      scene = (SceneRepresentation *)((long)scene + 0x20);
    }
  }
  return;
}

Assistant:

void ParseFiles(SceneRepresentation *scene, pstd::span<const std::string> filenames) {
    auto tokError = [](const char *msg, const FileLoc *loc) {
        ErrorExit(loc, "%s", msg);
    };

    // Process scene description
    if (filenames.empty()) {
        // Parse scene from standard input
        std::unique_ptr<Tokenizer> t = Tokenizer::CreateFromFile("-", tokError);
        if (t)
            parse(scene, std::move(t));
    } else {
        // Parse scene from input files
        for (const std::string &fn : filenames) {
            if (fn != "-")
                SetSearchDirectory(fn);

            std::unique_ptr<Tokenizer> t = Tokenizer::CreateFromFile(fn, tokError);
            if (t)
                parse(scene, std::move(t));
        }
    }
}